

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_urlencode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  int nLen_00;
  char *zString;
  ushort **ppuVar2;
  byte *pbVar3;
  uchar *zString_00;
  long lVar4;
  uchar zHex [3];
  uchar local_36 [2];
  int nLen;
  
  if (0 < nArg) {
    zString = jx9_value_to_string(*apArg,&nLen);
    if (0 < (long)nLen) {
      zHex[2] = '\0';
      zHex[0] = '%';
      zHex[1] = '\0';
      pbVar3 = (byte *)(zString + nLen);
      do {
        lVar4 = 0;
        while( true ) {
          if (pbVar3 <= zString + lVar4) {
            if (lVar4 == 0) {
              return 0;
            }
            jx9_result_string(pCtx,zString,(int)lVar4);
            return 0;
          }
          bVar1 = zString[lVar4];
          ppuVar2 = __ctype_b_loc();
          if ((((*ppuVar2)[bVar1] & 8) == 0) &&
             ((0x3b < bVar1 - 0x24 ||
              ((0x800000000000601U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) == 0)))) break;
          lVar4 = lVar4 + 1;
        }
        if (lVar4 != 0) {
          jx9_result_string(pCtx,zString,(int)lVar4);
        }
        if (bVar1 == 0x20) {
          local_36[0] = '+';
          zString_00 = local_36;
          nLen_00 = 1;
        }
        else {
          zHex[1] = "0123456789ABCDEF"[bVar1 >> 4];
          zHex[2] = "0123456789ABCDEF"[bVar1 & 0xf];
          zString_00 = zHex;
          nLen_00 = 3;
        }
        jx9_result_string(pCtx,(char *)zString_00,nLen_00);
        zString = zString + lVar4 + 1;
      } while( true );
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_urlencode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the URL encoding */
	SyUriEncode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}